

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

int __thiscall cppforth::Forth::returnStackRestore(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  
  this_00 = &this->returnStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  for (; uVar1 != 0; uVar1 = uVar1 - 1) {
    ForthStack<unsigned_int>::pop(this_00);
  }
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  this->next_command = uVar1;
  ForthStack<unsigned_int>::pop(this_00);
  return 0;
}

Assistant:

int returnStackRestore(){
			auto locals = returnStack.getTop();  returnStack.pop();
			while(locals-- > 0) {
				returnStack.pop();
			}
			next_command = returnStack.getTop(); returnStack.pop();
			return 0;
		}